

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::Colour::Parse
               (IMkvReader *reader,longlong colour_start,longlong colour_size,Colour **colour)

{
  long mm_size;
  bool bVar1;
  Colour *this;
  pointer pCVar2;
  long lVar3;
  longlong lVar4;
  long status;
  longlong child_size;
  longlong child_id;
  longlong read_pos;
  longlong colour_end;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> local_38;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> colour_ptr;
  Colour **colour_local;
  longlong colour_size_local;
  longlong colour_start_local;
  IMkvReader *reader_local;
  
  if ((reader == (IMkvReader *)0x0) || (*colour != (Colour *)0x0)) {
    reader_local._7_1_ = false;
  }
  else {
    colour_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t.
    super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
    super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::Colour,_std::default_delete<mkvparser::Colour>,_true,_true>)
         (__uniq_ptr_data<mkvparser::Colour,_std::default_delete<mkvparser::Colour>,_true,_true>)
         colour;
    this = (Colour *)operator_new(0x70);
    Colour(this);
    std::unique_ptr<mkvparser::Colour,std::default_delete<mkvparser::Colour>>::
    unique_ptr<std::default_delete<mkvparser::Colour>,void>
              ((unique_ptr<mkvparser::Colour,std::default_delete<mkvparser::Colour>> *)&local_38,
               this);
    pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::get
                       (&local_38);
    if (pCVar2 == (pointer)0x0) {
      reader_local._7_1_ = false;
    }
    else {
      read_pos = colour_start + colour_size;
      child_id = colour_start;
      do {
        if (read_pos <= child_id) {
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   release(&local_38);
          *(pointer *)
           colour_ptr._M_t.
           super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t.
           super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
           super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl = pCVar2;
          reader_local._7_1_ = true;
          goto LAB_0015cbc6;
        }
        child_size = 0;
        status = 0;
        lVar3 = ParseElementHeader(reader,&child_id,read_pos,&child_size,&status);
        lVar4 = child_id;
        mm_size = status;
        if (lVar3 < 0) {
          reader_local._7_1_ = false;
          goto LAB_0015cbc6;
        }
        if (child_size == 0x55b1) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->matrix_coefficients = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->matrix_coefficients < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else if (child_size == 0x55b2) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->bits_per_channel = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->bits_per_channel < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else if (child_size == 0x55b3) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->chroma_subsampling_horz = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->chroma_subsampling_horz < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else if (child_size == 0x55b4) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->chroma_subsampling_vert = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->chroma_subsampling_vert < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else if (child_size == 0x55b5) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->cb_subsampling_horz = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->cb_subsampling_horz < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else if (child_size == 0x55b6) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->cb_subsampling_vert = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->cb_subsampling_vert < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else if (child_size == 0x55b7) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->chroma_siting_horz = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->chroma_siting_horz < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else if (child_size == 0x55b8) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->chroma_siting_vert = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->chroma_siting_vert < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else if (child_size == 0x55b9) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->range = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->range < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else if (child_size == 0x55ba) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->transfer_characteristics = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->transfer_characteristics < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else if (child_size == 0x55bb) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->primaries = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->primaries < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else if (child_size == 0x55bc) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->max_cll = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->max_cll < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else if (child_size == 0x55bd) {
          lVar4 = UnserializeUInt(reader,child_id,status);
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar2->max_fall = lVar4;
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar2->max_fall < 0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        else {
          if (child_size != 0x55d0) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
          pCVar2 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          bVar1 = MasteringMetadata::Parse(reader,lVar4,mm_size,&pCVar2->mastering_metadata);
          if (!bVar1) {
            reader_local._7_1_ = false;
            goto LAB_0015cbc6;
          }
        }
        child_id = status + child_id;
      } while (child_id <= read_pos);
      reader_local._7_1_ = false;
    }
LAB_0015cbc6:
    colour_end._0_4_ = 1;
    std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::~unique_ptr
              (&local_38);
  }
  return reader_local._7_1_;
}

Assistant:

bool Colour::Parse(IMkvReader* reader, long long colour_start,
                   long long colour_size, Colour** colour) {
  if (!reader || *colour)
    return false;

  std::unique_ptr<Colour> colour_ptr(new Colour());
  if (!colour_ptr.get())
    return false;

  const long long colour_end = colour_start + colour_size;
  long long read_pos = colour_start;

  while (read_pos < colour_end) {
    long long child_id = 0;
    long long child_size = 0;

    const long status =
        ParseElementHeader(reader, read_pos, colour_end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvMatrixCoefficients) {
      colour_ptr->matrix_coefficients =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->matrix_coefficients < 0)
        return false;
    } else if (child_id == libwebm::kMkvBitsPerChannel) {
      colour_ptr->bits_per_channel =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->bits_per_channel < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSubsamplingHorz) {
      colour_ptr->chroma_subsampling_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_subsampling_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSubsamplingVert) {
      colour_ptr->chroma_subsampling_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_subsampling_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvCbSubsamplingHorz) {
      colour_ptr->cb_subsampling_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->cb_subsampling_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvCbSubsamplingVert) {
      colour_ptr->cb_subsampling_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->cb_subsampling_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSitingHorz) {
      colour_ptr->chroma_siting_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_siting_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSitingVert) {
      colour_ptr->chroma_siting_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_siting_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvRange) {
      colour_ptr->range = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->range < 0)
        return false;
    } else if (child_id == libwebm::kMkvTransferCharacteristics) {
      colour_ptr->transfer_characteristics =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->transfer_characteristics < 0)
        return false;
    } else if (child_id == libwebm::kMkvPrimaries) {
      colour_ptr->primaries = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->primaries < 0)
        return false;
    } else if (child_id == libwebm::kMkvMaxCLL) {
      colour_ptr->max_cll = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->max_cll < 0)
        return false;
    } else if (child_id == libwebm::kMkvMaxFALL) {
      colour_ptr->max_fall = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->max_fall < 0)
        return false;
    } else if (child_id == libwebm::kMkvMasteringMetadata) {
      if (!MasteringMetadata::Parse(reader, read_pos, child_size,
                                    &colour_ptr->mastering_metadata))
        return false;
    } else {
      return false;
    }

    read_pos += child_size;
    if (read_pos > colour_end)
      return false;
  }
  *colour = colour_ptr.release();
  return true;
}